

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrackControl.cpp
# Opt level: O2

void __thiscall
trackerboy::TrackControl::TrackControl(TrackControl *this,ChType ch,FrequencyControl *fc)

{
  undefined3 in_register_00000031;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000031,ch);
  Operation::Operation(&this->mOp);
  (this->mInstrument).super___shared_ptr<const_trackerboy::Instrument,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->mInstrument).super___shared_ptr<const_trackerboy::Instrument,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->mFc = fc;
  (this->mIr).super__Optional_base<trackerboy::InstrumentRuntime,_true,_true>._M_payload.
  super__Optional_payload_base<trackerboy::InstrumentRuntime>._M_engaged = false;
  (this->mDelayCounter).super__Optional_base<unsigned_char,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_char>._M_engaged = false;
  (this->mCutCounter).super__Optional_base<unsigned_char,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_char>._M_engaged = false;
  this->mHasSweep = iVar1 == 0;
  this->mPlaying = false;
  this->mEnvelope = (iVar1 == 2) * '\x10' + 0xf0;
  this->mPanning = '\x03';
  this->mTimbre = (iVar1 != 3) * '\x03';
  return;
}

Assistant:

TrackControl::TrackControl(ChType ch, FrequencyControl &fc) :
    mOp(),
    mInstrument(),
    mFc(fc),
    mIr(),
    mDelayCounter(),
    mCutCounter(),
    mHasSweep(ch == ChType::ch1),
    mPlaying(false),
    mEnvelope(ChannelState::defaultEnvelope(ch)),
    mPanning(ChannelState::defaultPanning(ch)),
    mTimbre(ChannelState::defaultTimbre(ch))
{
}